

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ObjMergeOrder(Nf_Man_t *p,int iObj)

{
  int nCutNum_00;
  int iVar1;
  int iVar2;
  int fCompl0;
  int fCompl1;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  word wVar10;
  int *piVar11;
  float fVar12;
  float fVar13;
  int fIsXor;
  Nf_Cut_t *pCut2Lim_1;
  Nf_Cut_t *pCut2_1;
  int fComp2;
  int nCuts2_1;
  Nf_Cut_t pCuts2_1 [32];
  Nf_Cut_t *pCut2Lim;
  Nf_Cut_t *pCut2;
  int nCuts2;
  int fCompE;
  Gia_Obj_t *pObjE;
  Nf_Cut_t pCuts2 [32];
  int local_136c;
  int nCutsR;
  int nCutsUse;
  int i;
  Nf_Cut_t *pCut1Lim;
  Nf_Cut_t *pCut0Lim;
  Nf_Cut_t *pCut1;
  Nf_Cut_t *pCut0;
  int iSibl;
  int fComp1;
  int fComp0;
  int nCuts1;
  int nCuts0;
  int nCutNum;
  int nLutSize;
  float dFlowRefs;
  Gia_Obj_t *pObj;
  Nf_Cut_t *pCutsR [32];
  Nf_Cut_t pCuts [32];
  Nf_Cut_t pCuts1 [32];
  Nf_Cut_t pCuts0 [32];
  int iObj_local;
  Nf_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pGia,iObj);
  fVar12 = Nf_ObjFlowRefs(p,iObj,0);
  fVar13 = Nf_ObjFlowRefs(p,iObj,1);
  fVar12 = fVar12 + fVar13;
  iVar9 = p->pPars->nLutSize;
  nCutNum_00 = p->pPars->nCutNum;
  iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
  iVar1 = Nf_ManPrepareCuts((Nf_Cut_t *)(pCuts1[0x1f].pLeaves + 5),p,iVar1,1);
  iVar2 = Gia_ObjFaninId1(pObj_00,iObj);
  iVar2 = Nf_ManPrepareCuts((Nf_Cut_t *)(pCuts[0x1f].pLeaves + 5),p,iVar2,1);
  fCompl0 = Gia_ObjFaninC0(pObj_00);
  fCompl1 = Gia_ObjFaninC1(pObj_00);
  iVar3 = Gia_ObjSibl(p->pGia,iObj);
  local_136c = 0;
  iVar4 = Gia_ObjIsBuf(pObj_00);
  if (iVar4 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x36d,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
  }
  for (nCutsR = 0; nCutsR < nCutNum_00; nCutsR = nCutsR + 1) {
    pCutsR[(long)nCutsR + -1] = (Nf_Cut_t *)(pCuts[(long)nCutsR + -1].pLeaves + 5);
  }
  if (iVar3 != 0) {
    pObj_01 = Gia_ObjSiblObj(p->pGia,iObj);
    uVar5 = Gia_ObjPhase(pObj_00);
    uVar6 = Gia_ObjPhase(pObj_01);
    iVar3 = Nf_ManPrepareCuts((Nf_Cut_t *)&pObjE,p,iVar3,0);
    pCuts2_1[0x1f].pLeaves._20_8_ = pCuts2[(long)iVar3 + -1].pLeaves + 5;
    for (pCut2Lim = (Nf_Cut_t *)&pObjE; pCut2Lim < (ulong)pCuts2_1[0x1f].pLeaves._20_8_;
        pCut2Lim = pCut2Lim + 1) {
      memcpy(pCutsR[(long)local_136c + -1],pCut2Lim,0x30);
      uVar7 = Abc_LitNotCond(*(uint *)&pCutsR[(long)local_136c + -1]->field_0x10 & 0x3ffffff,
                             uVar5 ^ uVar6);
      *(uint *)&pCutsR[(long)local_136c + -1]->field_0x10 =
           *(uint *)&pCutsR[(long)local_136c + -1]->field_0x10 & 0xfc000000 | uVar7 & 0x3ffffff;
      Nf_CutParams(p,pCutsR[(long)local_136c + -1],fVar12);
      local_136c = Nf_SetAddCut((Nf_Cut_t **)&pObj,local_136c,nCutNum_00);
    }
  }
  iVar3 = Gia_ObjIsMuxId(p->pGia,iObj);
  if (iVar3 == 0) {
    iVar3 = Gia_ObjIsXor(pObj_00);
    p->CutCount[0] = (double)(iVar1 * iVar2) + p->CutCount[0];
    for (pCut1 = (Nf_Cut_t *)(pCuts1[0x1f].pLeaves + 5);
        pCut1 < (Nf_Cut_t *)(pCuts1[(long)iVar1 + 0x1f].pLeaves + 5); pCut1 = pCut1 + 1) {
      for (pCut0Lim = (Nf_Cut_t *)(pCuts[0x1f].pLeaves + 5);
          pCut0Lim < (Nf_Cut_t *)(pCuts[(long)iVar2 + 0x1f].pLeaves + 5); pCut0Lim = pCut0Lim + 1) {
        if (((int)((*(uint *)&pCut1->field_0x10 >> 0x1b) + (*(uint *)&pCut0Lim->field_0x10 >> 0x1b))
             <= iVar9) || (iVar4 = Nf_CutCountBits(pCut1->Sign | pCut0Lim->Sign), iVar4 <= iVar9)) {
          p->CutCount[1] = p->CutCount[1] + 1.0;
          iVar4 = Nf_CutMergeOrder(pCut1,pCut0Lim,pCutsR[(long)local_136c + -1],iVar9);
          if ((iVar4 != 0) &&
             (iVar4 = Nf_SetLastCutIsContained((Nf_Cut_t **)&pObj,local_136c), iVar4 == 0)) {
            p->CutCount[2] = p->CutCount[2] + 1.0;
            iVar4 = Nf_CutComputeTruth6(p,pCut1,pCut0Lim,fCompl0,fCompl1,
                                        pCutsR[(long)local_136c + -1],iVar3);
            if (iVar4 != 0) {
              wVar10 = Nf_CutGetSign(pCutsR[(long)local_136c + -1]->pLeaves,
                                     *(uint *)&pCutsR[(long)local_136c + -1]->field_0x10 >> 0x1b);
              pCutsR[(long)local_136c + -1]->Sign = wVar10;
            }
            Nf_CutParams(p,pCutsR[(long)local_136c + -1],fVar12);
            local_136c = Nf_SetAddCut((Nf_Cut_t **)&pObj,local_136c,nCutNum_00);
          }
        }
      }
    }
  }
  else {
    iVar3 = Gia_ObjFaninId2(p->pGia,iObj);
    iVar3 = Nf_ManPrepareCuts((Nf_Cut_t *)&fComp2,p,iVar3,1);
    iVar4 = Gia_ObjFaninC2(p->pGia,pObj_00);
    p->CutCount[0] = (double)(iVar1 * iVar2 * iVar3) + p->CutCount[0];
    for (pCut1 = (Nf_Cut_t *)(pCuts1[0x1f].pLeaves + 5);
        pCut1 < (Nf_Cut_t *)(pCuts1[(long)iVar1 + 0x1f].pLeaves + 5); pCut1 = pCut1 + 1) {
      for (pCut0Lim = (Nf_Cut_t *)(pCuts[0x1f].pLeaves + 5);
          pCut0Lim < (Nf_Cut_t *)(pCuts[(long)iVar2 + 0x1f].pLeaves + 5); pCut0Lim = pCut0Lim + 1) {
        for (pCut2Lim_1 = (Nf_Cut_t *)&fComp2;
            pCut2Lim_1 < (Nf_Cut_t *)(&fComp2 + (long)iVar3 * 0xc); pCut2Lim_1 = pCut2Lim_1 + 1) {
          iVar8 = Nf_CutCountBits(pCut1->Sign | pCut0Lim->Sign | pCut2Lim_1->Sign);
          if (iVar8 <= iVar9) {
            p->CutCount[1] = p->CutCount[1] + 1.0;
            iVar8 = Nf_CutMergeOrderMux(pCut1,pCut0Lim,pCut2Lim_1,pCutsR[(long)local_136c + -1],
                                        iVar9);
            if ((iVar8 != 0) &&
               (iVar8 = Nf_SetLastCutIsContained((Nf_Cut_t **)&pObj,local_136c), iVar8 == 0)) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              iVar8 = Nf_CutComputeTruthMux6
                                (p,pCut1,pCut0Lim,pCut2Lim_1,fCompl0,fCompl1,iVar4,
                                 pCutsR[(long)local_136c + -1]);
              if (iVar8 != 0) {
                wVar10 = Nf_CutGetSign(pCutsR[(long)local_136c + -1]->pLeaves,
                                       *(uint *)&pCutsR[(long)local_136c + -1]->field_0x10 >> 0x1b);
                pCutsR[(long)local_136c + -1]->Sign = wVar10;
              }
              Nf_CutParams(p,pCutsR[(long)local_136c + -1],fVar12);
              local_136c = Nf_SetAddCut((Nf_Cut_t **)&pObj,local_136c,nCutNum_00);
            }
          }
        }
      }
    }
  }
  if ((0 < local_136c) && (local_136c < nCutNum_00)) {
    Nf_ObjSetCutFlow(p,iObj,*(float *)(pObj + 1));
    Nf_ObjSetCutDelay(p,iObj,pObj->Value);
    iVar9 = Nf_ManSaveCuts(p,(Nf_Cut_t **)&pObj,local_136c,0);
    piVar11 = Vec_IntEntryP(&p->vCutSets,iObj);
    *piVar11 = iVar9;
    p->CutCount[3] = (double)local_136c + p->CutCount[3];
    iVar9 = Nf_ManCountUseful((Nf_Cut_t **)&pObj,local_136c);
    p->CutCount[4] = (double)iVar9 + p->CutCount[4];
    p->nCutUseAll = (uint)(iVar9 == local_136c) + p->nCutUseAll;
    iVar9 = Nf_ManCountMatches(p,(Nf_Cut_t **)&pObj,local_136c);
    p->CutCount[5] = (double)iVar9 + p->CutCount[5];
    return;
  }
  __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                ,0x3b8,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
}

Assistant:

void Nf_ObjMergeOrder( Nf_Man_t * p, int iObj )
{
    Nf_Cut_t pCuts0[NF_CUT_MAX], pCuts1[NF_CUT_MAX], pCuts[NF_CUT_MAX], * pCutsR[NF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    //Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    float dFlowRefs  = Nf_ObjFlowRefs(p, iObj, 0) + Nf_ObjFlowRefs(p, iObj, 1);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Nf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Nf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Nf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsUse, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Nf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        int nCuts2  = Nf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Nf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Nf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 10000 == 0 )
//    if ( iObj == 1090 )
    {
        printf( "*** Obj = %d  Useful = %d\n", iObj, Nf_ManCountUseful(pCutsR, nCutsR) );
        for ( i = 0; i < nCutsR; i++ )
            Nf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Nf_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Nf_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Nf_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Nf_ManSaveCuts(p, pCutsR, nCutsR, 0);
    p->CutCount[3] += nCutsR;
    nCutsUse = Nf_ManCountUseful(pCutsR, nCutsR);
    p->CutCount[4] += nCutsUse;
    p->nCutUseAll  += nCutsUse == nCutsR;
    p->CutCount[5] += Nf_ManCountMatches(p, pCutsR, nCutsR);
}